

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O3

void __thiscall
async_simple::coro::detail::LazyPromise<cinatra::chunked_result>::unhandled_exception
          (LazyPromise<cinatra::chunked_result> *this)

{
  void *in_RAX;
  exception_ptr local_18;
  
  local_18._M_exception_object = in_RAX;
  std::current_exception();
  std::variant<std::monostate,cinatra::chunked_result,std::__exception_ptr::exception_ptr>::
  emplace<2ul,std::__exception_ptr::exception_ptr>
            ((variant<std::monostate,cinatra::chunked_result,std::__exception_ptr::exception_ptr> *)
             &this->_value,&local_18);
  if (local_18._M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  return;
}

Assistant:

void unhandled_exception() noexcept {
        _value.template emplace<std::exception_ptr>(std::current_exception());
    }